

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.c
# Opt level: O1

dePoolArray * dePoolArray_create(deMemPool *pool,int elementSize)

{
  dePoolArray *pdVar1;
  
  pdVar1 = (dePoolArray *)deMemPool_alloc(pool,0x20);
  if (pdVar1 == (dePoolArray *)0x0) {
    pdVar1 = (dePoolArray *)0x0;
  }
  else {
    pdVar1->pool = (deMemPool *)0x0;
    pdVar1->elementSize = 0;
    pdVar1->numElements = 0;
    pdVar1->capacity = 0;
    pdVar1->pageTableCapacity = 0;
    pdVar1->pageTable = (void **)0x0;
    pdVar1->pool = pool;
    pdVar1->elementSize = elementSize;
  }
  return pdVar1;
}

Assistant:

dePoolArray* dePoolArray_create (deMemPool* pool, int elementSize)
{
	/* Alloc struct. */
	dePoolArray* arr = DE_POOL_NEW(pool, dePoolArray);
	if (!arr)
		return DE_NULL;

	/* Init array. */
	memset(arr, 0, sizeof(dePoolArray));
	arr->pool			= pool;
	arr->elementSize	= elementSize;

	return arr;
}